

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeBlocksGenerator::CreateDummyTargetFile_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmLocalGenerator *lg,
          cmGeneratorTarget *target)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  ostream *poVar4;
  undefined1 local_2a8 [8];
  cmGeneratedFileStream fout;
  allocator local_2a;
  byte local_29;
  cmGeneratorTarget *local_28;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *lg_local;
  cmExtraCodeBlocksGenerator *this_local;
  string *filename;
  
  local_29 = 0;
  local_28 = target;
  target_local = (cmGeneratorTarget *)lg;
  lg_local = (cmLocalGenerator *)this;
  this_local = (cmExtraCodeBlocksGenerator *)__return_storage_ptr__;
  pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  (*(code *)(target_local->Target->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header.
            _M_node_count)(&fout.field_0x240,target_local,local_28);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&fout.field_0x240);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(local_28);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".objlib");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2a8,pcVar2,false);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)(local_2a8 + (long)*(_func_int **)((long)local_2a8 + -0x18)));
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)local_2a8,"# This is a dummy file for the OBJECT library ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(local_28);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4," for the CMake CodeBlocks project generator.\n");
    std::operator<<(poVar4,"# Don\'t edit, this file will be overwritten.\n");
  }
  local_29 = 1;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2a8);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::CreateDummyTargetFile(
                                        cmLocalGenerator* lg,
                                        cmGeneratorTarget* target) const
{
  // this file doesn't seem to be used by C::B in custom makefile mode,
  // but we generate a unique file for each OBJECT library so in case
  // C::B uses it in some way, the targets don't interfere with each other.
  std::string filename = lg->GetCurrentBinaryDirectory();
  filename += "/";
  filename += lg->GetTargetDirectory(target);
  filename += "/";
  filename += target->GetName();
  filename += ".objlib";
  cmGeneratedFileStream fout(filename.c_str());
  if(fout)
    {
    fout << "# This is a dummy file for the OBJECT library "
         << target->GetName()
         << " for the CMake CodeBlocks project generator.\n"
         << "# Don't edit, this file will be overwritten.\n";
    }
  return filename;
}